

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O1

void __thiscall QtMWidgets::ScrollArea::setWidget(ScrollArea *this,QWidget *widget)

{
  ScrollAreaPrivate *this_00;
  Data *pDVar1;
  char cVar2;
  QObject *pQVar3;
  Data *pDVar4;
  
  this_00 = (ScrollAreaPrivate *)(this->super_AbstractScrollArea).d.d;
  pDVar1 = (this_00->widget).wp.d;
  if ((pDVar1 == (Data *)0x0) || ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0))
  {
    pQVar3 = (QObject *)0x0;
  }
  else {
    pQVar3 = (this_00->widget).wp.value;
  }
  if ((widget != (QWidget *)0x0) && (pQVar3 != (QObject *)widget)) {
    pQVar3 = (QObject *)0x0;
    QWidget::setParent(&((this_00->super_AbstractScrollAreaPrivate).horIndicator)->super_QWidget);
    QWidget::setParent(&((this_00->super_AbstractScrollAreaPrivate).vertIndicator)->super_QWidget);
    QWidget::setParent(&((this_00->super_AbstractScrollAreaPrivate).horBlur)->super_QWidget);
    QWidget::setParent(&((this_00->super_AbstractScrollAreaPrivate).vertBlur)->super_QWidget);
    pDVar1 = (this_00->widget).wp.d;
    if (pDVar1 != (Data *)0x0) {
      if ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0) {
        pQVar3 = (QObject *)0x0;
      }
      else {
        pQVar3 = (this_00->widget).wp.value;
      }
    }
    if (pQVar3 != (QObject *)0x0) {
      (**(code **)(*(long *)pQVar3 + 0x20))(pQVar3);
    }
    pDVar1 = (this_00->widget).wp.d;
    (this_00->widget).wp.d = (Data *)0x0;
    (this_00->widget).wp.value = (QObject *)0x0;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
           (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(pDVar1);
      }
    }
    if (*(QWidget **)(*(long *)(widget + 8) + 0x10) !=
        (this_00->super_AbstractScrollAreaPrivate).viewport) {
      QWidget::setParent(widget);
    }
    cVar2 = QWidget::testAttribute_helper((WidgetAttribute)widget);
    if (cVar2 == '\0') {
      (**(code **)(*(long *)widget + 0x70))(widget);
      QWidget::resize((QSize *)widget);
    }
    pDVar4 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)widget);
    pDVar1 = (this_00->widget).wp.d;
    (this_00->widget).wp.d = pDVar4;
    (this_00->widget).wp.value = (QObject *)widget;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
           (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(pDVar1);
      }
    }
    QWidget::setParent(&((this_00->super_AbstractScrollAreaPrivate).horIndicator)->super_QWidget);
    QWidget::raise();
    QWidget::setParent(&((this_00->super_AbstractScrollAreaPrivate).vertIndicator)->super_QWidget);
    QWidget::raise();
    QWidget::setParent(&((this_00->super_AbstractScrollAreaPrivate).horBlur)->super_QWidget);
    QWidget::setParent(&((this_00->super_AbstractScrollAreaPrivate).vertBlur)->super_QWidget);
    QWidget::setAutoFillBackground(SUB81((this_00->widget).wp.value,0));
    QObject::installEventFilter((QObject *)widget);
    ScrollAreaPrivate::updateScrolledSize(this_00);
    QWidget::show();
  }
  return;
}

Assistant:

void
ScrollArea::setWidget( QWidget * widget )
{
	ScrollAreaPrivate * d = d_func();

	if( widget == d->widget || !widget )
		return;

	d->horIndicator->setParent( 0 );
	d->vertIndicator->setParent( 0 );
	d->horBlur->setParent( 0 );
	d->vertBlur->setParent( 0 );
	delete d->widget;
	d->widget = 0;
	if( widget->parentWidget() != d->viewport )
		widget->setParent( d->viewport );
	if( !widget->testAttribute( Qt::WA_Resized ) )
		widget->resize( widget->sizeHint() );
	d->widget = widget;
	d->horIndicator->setParent( d->widget );
	d->horIndicator->raise();
	d->vertIndicator->setParent( d->widget );
	d->vertIndicator->raise();
	d->horBlur->setParent( d->widget );
	d->vertBlur->setParent( d->widget );
	d->widget->setAutoFillBackground( true );
	widget->installEventFilter( this );
	d->updateScrolledSize();
	d->widget->show();
}